

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

char p_b_coll_elem(parse *p,int endc)

{
  char *__s2;
  int iVar1;
  size_t __n;
  bool bVar2;
  size_t len;
  cname *cp;
  char *sp;
  int endc_local;
  parse *p_local;
  
  __s2 = p->next;
  while( true ) {
    bVar2 = false;
    if (p->next < p->end) {
      bVar2 = false;
      if (((p->next < p->end) && (bVar2 = false, p->next + 1 < p->end)) &&
         (bVar2 = false, *p->next == endc)) {
        bVar2 = p->next[1] == ']';
      }
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (!bVar2) break;
    p->next = p->next + 1;
  }
  if (p->next < p->end) {
    __n = (long)p->next - (long)__s2;
    for (len = (size_t)cnames; *(long *)len != 0; len = len + 0x10) {
      iVar1 = strncmp(*(char **)len,__s2,__n);
      if ((iVar1 == 0) && (*(char *)(*(long *)len + __n) == '\0')) {
        return *(char *)(len + 8);
      }
    }
    if (__n == 1) {
      p_local._7_1_ = *__s2;
    }
    else {
      seterr(p,3);
      p_local._7_1_ = '\0';
    }
  }
  else {
    seterr(p,7);
    p_local._7_1_ = '\0';
  }
  return p_local._7_1_;
}

Assistant:

static char			/* value of collating element */
p_b_coll_elem(p, endc)
struct parse *p;
int endc;			/* name ended by endc,']' */
{
	char *sp = p->next;
	struct cname *cp;
	size_t len;

	while (MORE() && !SEETWO(endc, ']'))
		NEXT();
	if (!MORE()) {
		seterr(p, REG_EBRACK);
		return(0);
	}
	len = (size_t)(p->next - sp);
	for (cp = cnames; cp->name != NULL; cp++)
		if (strncmp(cp->name, sp, len) == 0 && cp->name[len] == '\0')
			return(cp->code);	/* known name */
	if (len == 1)
		return(*sp);	/* single character */
	seterr(p, REG_ECOLLATE);			/* neither */
	return(0);
}